

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_xlat.cpp
# Opt level: O1

void P_LoadTranslator(char *lumpname)

{
  int iVar1;
  yyParser *pParser_00;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  yyParser *pParser;
  byte bVar5;
  XlatParseContext context;
  FParseToken in_stack_fffffffffffffee8;
  FParseContext local_c0;
  undefined4 local_78;
  undefined4 local_70 [20];
  
  bVar5 = 0;
  iVar1 = strcasecmp(LastTranslator.Chars,lumpname);
  if (iVar1 != 0) {
    P_ClearTranslator();
    pParser_00 = (yyParser *)malloc(0x2278);
    if (pParser_00 != (yyParser *)0x0) {
      pParser_00->yyerrcnt = -1;
      pParser_00->yytos = pParser_00->yystack;
      pParser_00->yystack[0].stateno = 0;
      pParser_00->yystack[0].major = '\0';
    }
    local_c0.SourceFile = (char *)0x0;
    local_c0.symbols.Array = (FParseSymbol *)0x0;
    local_c0.symbols.Most = 0;
    local_c0.symbols.Count = 0;
    local_c0.SourceLine = 0;
    local_c0.Parse = XlatParse;
    local_c0.TokenTrans = TokenTrans;
    local_c0._vptr_FParseContext = (_func_int **)&PTR__FParseContext_0070eaf0;
    local_78 = 0xffffffff;
    local_c0.pParser = pParser_00;
    FParseContext::ParseLump(&local_c0,lumpname);
    local_70[0] = 0;
    puVar3 = (undefined8 *)local_70;
    puVar4 = (undefined8 *)&stack0xfffffffffffffee8;
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    XlatParse(pParser_00,0,in_stack_fffffffffffffee8,&local_c0);
    if (pParser_00 != (yyParser *)0x0) {
      while (pParser_00->yystack < pParser_00->yytos) {
        yy_pop_parser_stack(pParser_00);
      }
      free(pParser_00);
    }
    FString::operator=(&LastTranslator,lumpname);
    local_c0._vptr_FParseContext = (_func_int **)&PTR__FParseContext_0070eb40;
    TArray<FParseSymbol,_FParseSymbol>::~TArray(&local_c0.symbols);
  }
  return;
}

Assistant:

void P_LoadTranslator(const char *lumpname)
{
	// Only read the lump if it differs from the previous one.
	if (LastTranslator.CompareNoCase(lumpname))
	{
		// Clear the old data before parsing the lump.
		P_ClearTranslator();

		void *pParser = XlatParseAlloc(malloc);

		XlatParseContext context(pParser, XlatParse, TokenTrans);

		context.ParseLump(lumpname);
		FParseToken tok;
		tok.val=0;
		XlatParse(pParser, 0, tok, &context);
		XlatParseFree(pParser, free);
		LastTranslator = lumpname;
	}
}